

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::ExtensionRangeOptions::ByteSizeLong(ExtensionRangeOptions *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Rep *pRVar6;
  size_t sVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  long lVar9;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *pRVar10;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *pRVar11;
  
  sVar5 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.declaration_;
  pRVar10 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
              pRVar6->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                pRVar6->elements;
    }
  }
  lVar9 = sVar5 + (long)iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar10 !=
         (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = ExtensionRangeOptions_Declaration::ByteSizeLong
                      ((ExtensionRangeOptions_Declaration *)
                       (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar9 = lVar9 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  this_01 = &(this->field_0)._impl_.uninterpreted_option_;
  pRVar11 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x38) & 1) != 0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar6->elements;
    if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
      this_01 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar6->elements;
    }
  }
  sVar5 = lVar9 + (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  for (; pRVar11 !=
         (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar11 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                &(pRVar11->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = UninterpretedOption::ByteSizeLong
                      ((UninterpretedOption *)
                       (pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar3 & 3) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar7 = FeatureSet::ByteSizeLong((this->field_0)._impl_.features_);
      uVar4 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 2) != 0) {
      uVar8 = (long)(this->field_0)._impl_.verification_ | 1;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar9 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t ExtensionRangeOptions::ByteSizeLong() const {
  const ExtensionRangeOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.ExtensionRangeOptions.Declaration declaration = 2 [retention = RETENTION_SOURCE];
    {
      total_size += 1UL * this_._internal_declaration_size();
      for (const auto& msg : this_._internal_declaration()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.FeatureSet features = 50;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.ExtensionRangeOptions.VerificationState verification = 3 [default = UNVERIFIED, retention = RETENTION_SOURCE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_verification());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}